

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_deviate_delete_unique
              (lys_module *module,lys_deviate *deviate,lys_node_list *list,int index,char *value)

{
  uint local_44;
  uint local_40;
  int k;
  int j;
  int i;
  char *value_local;
  int index_local;
  lys_node_list *list_local;
  lys_deviate *deviate_local;
  lys_module *module_local;
  
  k = 0;
  do {
    if ((int)(uint)list->unique_size <= k) goto LAB_00170f65;
    if (list->unique[k].expr_size == deviate->unique[index].expr_size) {
      for (local_40 = 0;
          ((int)local_40 < (int)(uint)deviate->unique[index].expr_size &&
          (list->unique[k].expr[(int)local_40] == deviate->unique[index].expr[(int)local_40]));
          local_40 = local_40 + 1) {
      }
      if (local_40 == deviate->unique[index].expr_size) {
        for (local_40 = 0; (int)local_40 < (int)(uint)list->unique[k].expr_size;
            local_40 = local_40 + 1) {
          lydict_remove(module->ctx,list->unique[k].expr[(int)local_40]);
        }
        free(list->unique[k].expr);
        list->unique_size = list->unique_size + 0xff;
        if (k != (uint)list->unique_size) {
          list->unique[k].expr_size = list->unique[list->unique_size].expr_size;
          list->unique[k].expr = list->unique[list->unique_size].expr;
        }
        if (list->unique_size == '\0') {
          free(list->unique);
          list->unique = (lys_unique *)0x0;
        }
        else {
          list->unique[list->unique_size].expr_size = '\0';
          list->unique[list->unique_size].expr = (char **)0x0;
        }
        local_44 = k;
        k = -1;
LAB_00170f65:
        if (k == -1) {
          local_40 = -1;
          while (local_40 = lys_ext_iter(list->ext,list->ext_size,(char)local_40 + '\x01',
                                         LYEXT_SUBSTMT_UNIQUE), local_40 != -1) {
            if (list->ext[(int)local_40]->insubstmt_index == local_44) {
              lyp_ext_instance_rm(module->ctx,&list->ext,&list->ext_size,(uint8_t)local_40);
              local_40 = local_40 + -1;
            }
            else if ((int)local_44 < (int)(uint)list->ext[(int)local_40]->insubstmt_index) {
              list->ext[(int)local_40]->insubstmt_index =
                   list->ext[(int)local_40]->insubstmt_index + 0xff;
            }
          }
          module_local._4_4_ = 0;
        }
        else {
          ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,value,"unique");
          ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Value differs from the target being deleted.");
          module_local._4_4_ = 1;
        }
        return module_local._4_4_;
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int
yang_deviate_delete_unique(struct lys_module *module, struct lys_deviate *deviate,
                           struct lys_node_list *list, int index, char * value)
{
    int i, j, k;

    /* find unique structures to delete */
    for (i = 0; i < list->unique_size; i++) {
        if (list->unique[i].expr_size != deviate->unique[index].expr_size) {
            continue;
        }

        for (j = 0; j < deviate->unique[index].expr_size; j++) {
            if (!ly_strequal(list->unique[i].expr[j], deviate->unique[index].expr[j], 1)) {
                break;
            }
        }

        if (j == deviate->unique[index].expr_size) {
            /* we have a match, free the unique structure ... */
            for (j = 0; j < list->unique[i].expr_size; j++) {
                lydict_remove(module->ctx, list->unique[i].expr[j]);
            }
            free(list->unique[i].expr);
            /* ... and maintain the array */
            list->unique_size--;
            if (i != list->unique_size) {
                list->unique[i].expr_size = list->unique[list->unique_size].expr_size;
                list->unique[i].expr = list->unique[list->unique_size].expr;
            }

            if (!list->unique_size) {
                free(list->unique);
                list->unique = NULL;
            } else {
                list->unique[list->unique_size].expr_size = 0;
                list->unique[list->unique_size].expr = NULL;
            }

            k = i; /* remember index for removing extensions */
            i = -1; /* set match flag */
            break;
        }
    }

    if (i != -1) {
        /* no match found */
        LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "unique");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Value differs from the target being deleted.");
        return EXIT_FAILURE;
    }

    /* remove extensions of this unique instance from the target node */
    j = -1;
    while ((j = lys_ext_iter(list->ext, list->ext_size, j + 1, LYEXT_SUBSTMT_UNIQUE)) != -1) {
        if (list->ext[j]->insubstmt_index == k) {
            lyp_ext_instance_rm(module->ctx, &list->ext, &list->ext_size, j);
            --j;
        } else if (list->ext[j]->insubstmt_index > k) {
            /* decrease the substatement index of the extension because of the changed array of uniques */
            list->ext[j]->insubstmt_index--;
        }
    }
    return EXIT_SUCCESS;
}